

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

IterateResult __thiscall
glcts::TextureCubeMapArraySamplingTest::iterate(TextureCubeMapArraySamplingTest *this)

{
  shadersVectorType *this_00;
  pointer *ppsVar1;
  TestLog *this_01;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_02;
  char *description;
  iterator iVar4;
  TestContext *this_03;
  bool bVar5;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [8];
  _func_int **pp_Stack_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [4];
  ios_base local_128 [264];
  long lVar3;
  
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported != false) {
    this_00 = &this->m_shaders;
    local_1a0 = (undefined1  [8])0x0;
    pp_Stack_198 = (_func_int **)0x1ab5cba;
    iVar4._M_current =
         (this->m_shaders).
         super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->m_shaders).
        super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
      ::_M_realloc_insert<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
                (this_00,iVar4,(shaderConfiguration *)local_1a0);
      iVar4._M_current =
           (this->m_shaders).
           super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->m_type = Compute;
      (iVar4._M_current)->m_primitive_type = 0;
      (iVar4._M_current)->m_name = "Compute";
      iVar4._M_current =
           (this->m_shaders).
           super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_shaders).
      super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1a0 = (undefined1  [8])&DAT_00000001;
    pp_Stack_198 = (_func_int **)0x1b7e076;
    if (iVar4._M_current ==
        (this->m_shaders).
        super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
      ::_M_realloc_insert<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
                (this_00,iVar4,(shaderConfiguration *)local_1a0);
      iVar4._M_current =
           (this->m_shaders).
           super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar4._M_current)->m_type = Fragment;
      (iVar4._M_current)->m_primitive_type = 0;
      (iVar4._M_current)->m_name = "Fragment";
      iVar4._M_current =
           (this->m_shaders).
           super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_shaders).
      super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_1a0 = (undefined1  [8])0x5;
    pp_Stack_198 = (_func_int **)0x1ccbc1f;
    if (iVar4._M_current ==
        (this->m_shaders).
        super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
      ::_M_realloc_insert<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
                (this_00,iVar4,(shaderConfiguration *)local_1a0);
    }
    else {
      (iVar4._M_current)->m_type = Vertex;
      (iVar4._M_current)->m_primitive_type = 0;
      (iVar4._M_current)->m_name = "Vertex";
      ppsVar1 = &(this->m_shaders).
                 super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
    if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) {
      local_1a0 = (undefined1  [8])0x2;
      pp_Stack_198 = (_func_int **)0x1c2e829;
      iVar4._M_current =
           (this->m_shaders).
           super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_shaders).
          super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
        ::_M_realloc_insert<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
                  (this_00,iVar4,(shaderConfiguration *)local_1a0);
      }
      else {
        (iVar4._M_current)->m_type = Geometry;
        (iVar4._M_current)->m_primitive_type = 0;
        (iVar4._M_current)->m_name = "Geometry";
        ppsVar1 = &(this->m_shaders).
                   super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppsVar1 = *ppsVar1 + 1;
      }
    }
    if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
      local_1a0._4_4_ = (this->super_TestCaseBase).m_glExtTokens.PATCHES;
      local_1a0._0_4_ = Tesselation_Control;
      pp_Stack_198 = (_func_int **)0x1b7e07f;
      iVar4._M_current =
           (this->m_shaders).
           super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_shaders).
          super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
        ::_M_realloc_insert<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
                  (this_00,iVar4,(shaderConfiguration *)local_1a0);
        iVar4._M_current =
             (this->m_shaders).
             super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar4._M_current)->m_type = Tesselation_Control;
        (iVar4._M_current)->m_primitive_type = local_1a0._4_4_;
        (iVar4._M_current)->m_name = "Tesselation_Control";
        iVar4._M_current =
             (this->m_shaders).
             super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->m_shaders).
        super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
      }
      local_1a0._4_4_ = (this->super_TestCaseBase).m_glExtTokens.PATCHES;
      local_1a0._0_4_ = 4;
      pp_Stack_198 = (_func_int **)0x1b7e093;
      if (iVar4._M_current ==
          (this->m_shaders).
          super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
        ::_M_realloc_insert<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>
                  (this_00,iVar4,(shaderConfiguration *)local_1a0);
      }
      else {
        (iVar4._M_current)->m_type = 4;
        (iVar4._M_current)->m_primitive_type = local_1a0._4_4_;
        (iVar4._M_current)->m_name = "Tesselation_Evaluation";
        ppsVar1 = &(this->m_shaders).
                   super__Vector_base<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration,_std::allocator<glcts::TextureCubeMapArraySamplingTest::shaderConfiguration>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppsVar1 = *ppsVar1 + 1;
      }
    }
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar3 + 0x6d0))(1,&this->m_framebuffer_object_id);
    if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
      (**(code **)(lVar3 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
    }
    (**(code **)(lVar3 + 0xff0))(0xd05,1);
    (**(code **)(lVar3 + 0xff0))(0xcf5,1);
    testFormats(this,&this->m_formats,&this->m_resolutions);
    testFormats(this,&this->m_compressed_formats,&this->m_compressed_resolutions);
    if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
      (**(code **)(lVar3 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    }
    (**(code **)(lVar3 + 0xff0))(0xd05,4);
    (**(code **)(lVar3 + 0xff0))(0xcf5,4);
    (**(code **)(lVar3 + 0x440))(1,&this->m_framebuffer_object_id);
    this->m_framebuffer_object_id = 0;
    this_01 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"Summary","");
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,0x1af8059);
    tcu::LogSection::LogSection((LogSection *)local_1a0,&local_1c0,&local_1e0);
    tcu::TestLog::startSection(this_01,(char *)local_1a0,local_180._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != local_170) {
      operator_delete(local_180._M_p,local_170[0]._M_allocated_capacity + 1);
    }
    if (local_1a0 != (undefined1  [8])&local_190) {
      operator_delete((void *)local_1a0,local_190._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    bVar5 = this->invalid_type_cases != 0 || this->failed_cases != 0;
    if (bVar5) {
      local_1a0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_198,"Test failed! Number of found errors: ",0x25);
      std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_198);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_198);
      std::ios_base::~ios_base(local_128);
      local_1a0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_198,"Invalid shaders: ",0x11);
      std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_198);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_198);
      std::ios_base::~ios_base(local_128);
      local_1a0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_198,"Invalid programs: ",0x12);
      std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_198);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_198);
      std::ios_base::~ios_base(local_128);
      local_1a0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_198,
                 "glGetActiveUniform or glGetProgramResourceiv reported invalid type: ",0x44);
      std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_198);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_198);
      std::ios_base::~ios_base(local_128);
      this_03 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
    }
    else {
      this_03 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
    }
    tcu::TestContext::setTestResult(this_03,(uint)bVar5,description);
    local_1a0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_198,"Number of executed test cases: ",0x1f);
    std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_198);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_198);
    std::ios_base::~ios_base(local_128);
    local_1a0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_198,"Total shaders: ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_198);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_198);
    std::ios_base::~ios_base(local_128);
    local_1a0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_198,"Total programs: ",0x10);
    std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_198);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_198);
    std::ios_base::~ios_base(local_128);
    tcu::TestLog::endSection
              (((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log);
    return STOP;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_02,"Texture cube map array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
             ,0xc59);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TextureCubeMapArraySamplingTest::iterate()
{
#if TEXTURECUBEMAPARRAYSAMPLINGTEST_DUMP_TEXTURES_FOR_COMPRESSION

	for (resolutionsVectorType::iterator resolution		= m_compressed_resolutions.begin(),
										 end_resolution = m_compressed_resolutions.end();
		 end_resolution != resolution; ++resolution)
	{
		prepareDumpForTextureCompression(*resolution);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;

#else  /* TEXTURECUBEMAPARRAYSAMPLINGTEST_DUMP_TEXTURES_FOR_COMPRESSION */

	if (false == m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	// These shader stages are always supported
	m_shaders.push_back(shaderConfiguration(Compute, GL_POINTS, "Compute"));
	m_shaders.push_back(shaderConfiguration(Fragment, GL_POINTS, "Fragment"));
	m_shaders.push_back(shaderConfiguration(Vertex, GL_POINTS, "Vertex"));

	// Check if geometry shader is supported
	if (true == m_is_geometry_shader_extension_supported)
	{
		m_shaders.push_back(shaderConfiguration(Geometry, GL_POINTS, "Geometry"));
	}

	// Check if tesselation shaders are supported
	if (true == m_is_tessellation_shader_supported)
	{
		m_shaders.push_back(shaderConfiguration(Tesselation_Control, m_glExtTokens.PATCHES, "Tesselation_Control"));
		m_shaders.push_back(
			shaderConfiguration(Tesselation_Evaluation, m_glExtTokens.PATCHES, "Tesselation_Evaluation"));
	}

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(1, &m_framebuffer_object_id);

	if (true == m_is_tessellation_shader_supported)
	{
		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	}

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	testFormats(m_formats, m_resolutions);
	testFormats(m_compressed_formats, m_compressed_resolutions);

	if (true == m_is_tessellation_shader_supported)
	{
		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);
	}

	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	gl.deleteFramebuffers(1, &m_framebuffer_object_id);
	m_framebuffer_object_id = 0;

	m_testCtx.getLog() << tcu::TestLog::Section("Summary", "");
	if ((0 != failed_cases) || (0 != invalid_type_cases))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! Number of found errors: " << failed_cases
						   << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid shaders: " << invalid_shaders
						   << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid programs: " << invalid_programs
						   << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetActiveUniform or glGetProgramResourceiv reported invalid type: "
						   << invalid_type_cases << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Number of executed test cases: " << tested_cases
					   << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Total shaders: " << compiled_shaders << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Total programs: " << linked_programs << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::EndSection;

	return STOP;
#endif /* TEXTURECUBEMAPARRAYSAMPLINGTEST_DUMP_TEXTURES_FOR_COMPRESSION */
}